

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O3

Clause * __thiscall Inferences::CompositeISE::simplify(CompositeISE *this,Clause *cl)

{
  int iVar1;
  undefined4 extraout_var;
  ISList *pIVar2;
  
  pIVar2 = this->_inners;
  if (pIVar2 != (ISList *)0x0 && cl != (Clause *)0x0) {
    do {
      iVar1 = (*(pIVar2->_head->super_InferenceEngine)._vptr_InferenceEngine[6])(pIVar2->_head,cl);
      if ((Clause *)CONCAT44(extraout_var,iVar1) != cl) {
        return (Clause *)CONCAT44(extraout_var,iVar1);
      }
      pIVar2 = pIVar2->_tail;
    } while (pIVar2 != (List<Inferences::ImmediateSimplificationEngine_*> *)0x0);
  }
  return cl;
}

Assistant:

Clause* CompositeISE::simplify(Clause* cl)
{
  ISList* curr=_inners;
  while(curr && cl) {
    Clause* newCl=curr->head()->simplify(cl);
    if(newCl==cl) {
      curr=curr->tail();
    } else {
      return newCl;
    }
  }
  return cl;
}